

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

void __thiscall DebugUtilsData::EndLabelRegion(DebugUtilsData *this,XrSession session)

{
  XrSdkSessionLabelList *label_vec;
  
  label_vec = GetSessionLabelList(this,session);
  if (label_vec != (XrSdkSessionLabelList *)0x0) {
    RemoveIndividualLabel(this,label_vec);
    if ((label_vec->
        super__Vector_base<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (label_vec->
        super__Vector_base<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
      ::pop_back(label_vec);
      return;
    }
  }
  return;
}

Assistant:

void DebugUtilsData::EndLabelRegion(XrSession session) {
    XrSdkSessionLabelList* vec_ptr = GetSessionLabelList(session);
    if (vec_ptr == nullptr) {
        return;
    }

    // Individual labels do not stay around in the transition out of label region
    RemoveIndividualLabel(*vec_ptr);

    // Remove the last label region
    if (!vec_ptr->empty()) {
        vec_ptr->pop_back();
    }
}